

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uconv.h
# Opt level: O0

size_t __thiscall
booster::locale::impl_icu::icu_std_converter<char,_1>::uconv::cut
          (uconv *this,size_t n,char_type *begin,char_type *end)

{
  UBool UVar1;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  UErrorCode err;
  char_type *saved;
  UErrorCode local_34;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  long local_18;
  
  local_30 = in_RDX;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  while( true ) {
    if (local_18 == 0 || local_28 <= local_20) {
      return local_20 - local_30;
    }
    local_34 = U_ZERO_ERROR;
    ucnv_getNextUChar_70(*in_RDI,&local_20,local_28,&local_34);
    UVar1 = U_FAILURE(local_34);
    if (UVar1 != '\0') break;
    local_18 = local_18 + -1;
  }
  return 0;
}

Assistant:

size_t cut(size_t n,char_type const *begin,char_type const *end)
            {
                char_type const *saved = begin;
                while(n > 0 && begin < end) {
                    UErrorCode err=U_ZERO_ERROR;
                    ucnv_getNextUChar(cvt_,&begin,end,&err);
                    if(U_FAILURE(err))
                        return 0;
                    n--;
                }
                return begin - saved;
            }